

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

alik_css_seas_object alik_css_seas_init(int p,int d,int q,int s,int P,int D,int Q,int N)

{
  uint uVar1;
  alik_css_seas_object paVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  
  uVar4 = P * s + p;
  iVar3 = Q * s;
  uVar1 = iVar3 + 1 + q;
  if (iVar3 + q < (int)uVar4) {
    uVar1 = uVar4;
  }
  paVar2 = (alik_css_seas_object)malloc((long)(int)uVar1 * 0x10 + (long)N * 0x18 + 0x60);
  paVar2->p = p;
  paVar2->d = d;
  paVar2->q = q;
  paVar2->s = s;
  paVar2->P = P;
  paVar2->D = D;
  paVar2->Q = Q;
  paVar2->N = N;
  paVar2->length = N;
  iVar5 = p + q + P + Q;
  paVar2->pq = iVar5;
  paVar2->M = 0;
  if (D == 0 && d == 0) {
    paVar2->pq = iVar5 + 1;
    paVar2->M = 1;
  }
  uVar6 = iVar3 + q + 1;
  if ((int)uVar6 < (int)uVar4) {
    uVar6 = uVar4;
  }
  paVar2->r = uVar6;
  paVar2->offset = uVar6 * 2;
  if (0 < (int)uVar6) {
    memset(paVar2->x,0,(ulong)uVar6 * 8);
    memset(paVar2->x + (int)uVar1,0,(ulong)uVar6 << 3);
  }
  dVar7 = macheps();
  paVar2->eps = dVar7;
  paVar2->mean = 0.0;
  return paVar2;
}

Assistant:

alik_css_seas_object alik_css_seas_init(int p, int d, int q, int s, int P, int D, int Q, int N) {
	alik_css_seas_object obj = NULL;
	int i, r, t;

	r = p + s*P;

	t = q + s*Q + 1;

	if (r < t) {
		r = t;
	}
	else {
		t = r;
	}

	obj = (alik_css_seas_object)malloc(sizeof(struct alik_css_seas_set) + sizeof(double)* 2 * r + sizeof(double)* 3 * N);

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->N = N;
	obj->length = N;
	obj->pq = p + q + P + Q;

	obj->M = 0;

	if (d == 0 && D == 0) {
		obj->pq = obj->pq + 1;
		obj->M = 1;
	}

	obj->r = p + s * P;

	t = 1 + q + s*Q;
	if (obj->r < t) {
		obj->r = t;
	}
	t = obj->r;
	obj->offset = 2 * obj->r;

	for (i = 0; i < t; ++i) {
		obj->x[i] = 0.0;// phi
	}

	for (i = 0; i < t; ++i) {
		obj->x[i + r] = 0.0;//theta
	}
	obj->eps = macheps();
	obj->mean = 0.0;

	return obj;
}